

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_refs.h
# Opt level: O3

bool dukglue::detail::RefManager::find_and_push_native_object(duk_context *ctx,void *obj_ptr)

{
  _Hashtable<void_*,_std::pair<void_*const,_unsigned_int>,_std::allocator<std::pair<void_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  iterator iVar1;
  void *local_18;
  
  local_18 = obj_ptr;
  this = &get_ref_map(ctx)->_M_h;
  iVar1 = std::
          _Hashtable<void_*,_std::pair<void_*const,_unsigned_int>,_std::allocator<std::pair<void_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(this,&local_18);
  if (iVar1.super__Node_iterator_base<std::pair<void_*const,_unsigned_int>,_false>._M_cur !=
      (__node_type *)0x0) {
    push_ref_array(ctx);
    duk_get_prop_index(ctx,-1,*(duk_uarridx_t *)
                               ((long)iVar1.
                                      super__Node_iterator_base<std::pair<void_*const,_unsigned_int>,_false>
                                      ._M_cur + 0x10));
    duk_remove(ctx,-2);
  }
  return iVar1.super__Node_iterator_base<std::pair<void_*const,_unsigned_int>,_false>._M_cur !=
         (__node_type *)0x0;
}

Assistant:

static bool find_and_push_native_object(duk_context* ctx, void* obj_ptr)
			{
				RefMap* ref_map = get_ref_map(ctx);

				const auto it = ref_map->find(obj_ptr);

				if (it == ref_map->end()) {
					return false;
				} else {
					push_ref_array(ctx);
					duk_get_prop_index(ctx, -1, it->second);
					duk_remove(ctx, -2);
					return true;
				}
			}